

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gridsample.cpp
# Opt level: O2

int __thiscall
ncnn::GridSample::forward
          (GridSample *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  uint w;
  uint uVar1;
  pointer pMVar2;
  Mat *this_00;
  size_t _elemsize;
  int *piVar3;
  uint _h;
  uint uVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  int iVar8;
  int iVar9;
  ulong uVar10;
  int align_corner;
  int align_corner_00;
  int align_corner_01;
  int align_corner_02;
  int align_corner_03;
  int align_corner_04;
  ulong uVar11;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong uVar12;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  int iVar13;
  int iVar14;
  int iVar15;
  void *pvVar16;
  void *pvVar17;
  uint uVar18;
  void *pvVar19;
  float *pfVar20;
  int x;
  void *pvVar21;
  void *pvVar22;
  int x_00;
  int iVar23;
  void *pvVar24;
  int x_01;
  long lVar25;
  long lVar26;
  long lVar27;
  bool bVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  int local_2f0;
  void *local_2d8;
  void *local_2a8;
  int local_28c;
  void *local_288;
  void *local_278;
  Mat m;
  void *local_208;
  undefined8 uStack_200;
  void *local_1f8;
  void *local_1e0;
  void *local_1d8;
  void *local_1c8;
  void *local_198;
  void *local_188;
  void *local_160;
  void *local_158;
  void *local_150;
  Mat local_148;
  undefined8 local_f8;
  float local_e8;
  uint local_d0;
  int local_cc;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  float local_98;
  float local_88;
  void *local_70;
  void *local_68;
  void *local_60;
  float x_coeffs [4];
  float y_coeffs [4];
  
  pMVar2 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar4 = pMVar2->w;
  local_208._0_4_ = uVar4;
  w = pMVar2->h;
  uVar5 = pMVar2->c;
  pvVar6 = (void *)(ulong)uVar5;
  _elemsize = pMVar2->elemsize;
  if (pMVar2->dims != 4) {
    if (pMVar2->dims != 3) {
      return 0;
    }
    uVar11 = (ulong)(this->permute_fusion == 0);
    uVar1 = (&pMVar2[1].w)[uVar11];
    pvVar19 = (void *)(ulong)uVar1;
    _h = (&pMVar2[1].h)[uVar11 * 2];
    Mat::create(this_00,uVar1,_h,uVar5,_elemsize,opt->blob_allocator);
    local_148.cstep = 0;
    local_148.data = (void *)0x0;
    local_148.refcount._0_4_ = 0;
    local_148.refcount._4_4_ = 0;
    local_148.elemsize._0_4_ = 0;
    local_148.elemsize._4_4_ = 0;
    local_148.elempack = 0;
    local_148.allocator = (Allocator *)0x0;
    local_148.dims = 0;
    local_148.w = 0;
    local_148.h = 0;
    local_148.d = 0;
    local_148.c = 0;
    Mat::create(&local_148,uVar1,_h,pMVar2[1].c,_elemsize,opt->workspace_allocator);
    if ((((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) ||
        (local_2d8 = local_148.data, local_148.data == (void *)0x0)) ||
       ((long)local_148.c * local_148.cstep == 0)) {
      piVar3 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
      if (piVar3 != (int *)0x0) {
        LOCK();
        *piVar3 = *piVar3 + -1;
        UNLOCK();
        if (*piVar3 == 0) {
          if (local_148.allocator == (Allocator *)0x0) {
            free(local_148.data);
          }
          else {
            (*(local_148.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      return -100;
    }
    if (this->permute_fusion == 0) {
      pvVar21 = (void *)(local_148.cstep *
                         CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) +
                        (long)local_148.data);
      uVar11 = 0;
      uVar18 = 0;
      if (0 < (int)uVar1) {
        uVar18 = uVar1;
      }
      uVar10 = 0;
      if (0 < (int)_h) {
        uVar10 = (ulong)_h;
      }
      for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
        iVar8 = this->align_corner;
        lVar26 = pMVar2[1].cstep * pMVar2[1].elemsize * uVar11;
        pvVar24 = pMVar2[1].data;
        lVar25 = 0;
        uVar12 = uVar11;
        for (lVar27 = 0; uVar18 != (uint)lVar27; lVar27 = lVar27 + 1) {
          fVar30 = *(float *)((long)pvVar24 + lVar27 * 8 + lVar26 + 4);
          fVar29 = grid_sample_unormalize
                             ((ncnn *)(ulong)uVar4,iVar8,
                              *(float *)((long)pvVar24 + lVar27 * 8 + lVar26),(int)uVar12);
          fVar30 = grid_sample_unormalize((ncnn *)(ulong)w,iVar8,fVar30,align_corner_02);
          *(float *)((long)local_2d8 + lVar27 * 4) = fVar29;
          *(float *)((long)pvVar21 + lVar27 * 4) = fVar30;
          lVar25 = lVar25 + -4;
          uVar12 = extraout_RDX_01;
        }
        pvVar21 = (void *)((long)pvVar21 - lVar25);
        local_2d8 = (void *)((long)local_2d8 - lVar25);
      }
    }
    else {
      local_2a8 = pMVar2[1].data;
      pvVar24 = (void *)(pMVar2[1].elemsize * pMVar2[1].cstep + (long)local_2a8);
      pvVar21 = (void *)(local_148.cstep *
                         CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) +
                        (long)local_148.data);
      iVar8 = 0;
      uVar18 = 0;
      if (0 < (int)uVar1) {
        uVar18 = uVar1;
      }
      uVar11 = 0;
      if (0 < (int)_h) {
        uVar11 = (ulong)_h;
      }
      iVar15 = (int)uVar11;
      for (; iVar8 != iVar15; iVar8 = iVar8 + 1) {
        iVar23 = this->align_corner;
        lVar25 = 0;
        for (lVar27 = 0; uVar18 != (uint)lVar27; lVar27 = lVar27 + 1) {
          fVar30 = *(float *)((long)pvVar24 + lVar27 * 4);
          fVar29 = grid_sample_unormalize
                             ((ncnn *)(ulong)uVar4,iVar23,*(float *)((long)local_2a8 + lVar27 * 4),
                              (int)uVar11);
          fVar30 = grid_sample_unormalize((ncnn *)(ulong)w,iVar23,fVar30,align_corner);
          *(float *)((long)local_2d8 + lVar27 * 4) = fVar29;
          *(float *)((long)pvVar21 + lVar27 * 4) = fVar30;
          lVar25 = lVar25 + -4;
          uVar11 = extraout_RDX;
        }
        pvVar21 = (void *)((long)pvVar21 - lVar25);
        local_2d8 = (void *)((long)local_2d8 - lVar25);
        pvVar24 = (void *)((long)pvVar24 - lVar25);
        local_2a8 = (void *)((long)local_2a8 - lVar25);
      }
    }
    pvVar21 = local_148.data;
    iVar8 = this->sample_type;
    if (iVar8 == 1) {
      pvVar21 = (void *)0x0;
      if ((int)uVar1 < 1) {
        pvVar19 = pvVar21;
      }
      if ((int)_h < 1) {
        _h = 0;
      }
      if ((int)uVar5 < 1) {
        pvVar6 = pvVar21;
      }
      local_b8 = local_148.data;
      pvVar24 = (void *)(CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) *
                         local_148.cstep + (long)local_148.data);
      while (pvVar21 != pvVar6) {
        m.w = pMVar2->w;
        m.h = pMVar2->h;
        m.elemsize = pMVar2->elemsize;
        m.data = (void *)(pMVar2->cstep * (long)pvVar21 * m.elemsize + (long)pMVar2->data);
        m.c = pMVar2->d;
        m.elempack = pMVar2->elempack;
        m.allocator = pMVar2->allocator;
        m.refcount = (int *)0x0;
        m.d = 1;
        m.dims = pMVar2->dims + -1;
        m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
        if (pMVar2->dims == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        local_1c8 = (void *)(this_00->cstep * (long)pvVar21 * this_00->elemsize +
                            (long)this_00->data);
        local_198 = local_b8;
        uVar5 = 0;
        local_188 = pvVar24;
        local_a8 = pvVar21;
        while (uVar5 != _h) {
          local_f8 = (void *)CONCAT44(local_f8._4_4_,uVar5);
          iVar8 = this->padding_mode;
          local_e8 = (float)this->align_corner;
          lVar25 = 0;
          for (lVar27 = 0; fVar30 = local_e8, local_2f0 = (int)pvVar19, local_2f0 != (int)lVar27;
              lVar27 = lVar27 + 1) {
            fVar29 = *(float *)((long)local_188 + lVar27 * 4);
            fVar37 = compute_coord(*(float *)((long)local_198 + lVar27 * 4),uVar4,iVar8,
                                   (int)local_e8);
            fVar30 = compute_coord(fVar29,w,iVar8,(int)fVar30);
            fVar29 = floorf(fVar37);
            iVar23 = (int)fVar29;
            fVar31 = floorf(fVar30);
            iVar15 = (int)fVar31;
            fVar32 = get_value_bounded(&m,iVar23,iVar15);
            fVar33 = get_value_bounded(&m,iVar23 + 1,iVar15);
            fVar34 = get_value_bounded(&m,iVar23,iVar15 + 1);
            fVar35 = get_value_bounded(&m,iVar23 + 1,iVar15 + 1);
            fVar37 = fVar37 - (float)(int)fVar29;
            fVar29 = fVar32 * (1.0 - fVar37) + fVar33 * fVar37;
            *(float *)((long)local_1c8 + lVar27 * 4) =
                 ((fVar35 * fVar37 + fVar34 * (1.0 - fVar37)) - fVar29) *
                 (fVar30 - (float)(int)fVar31) + fVar29;
            lVar25 = lVar25 + -4;
          }
          local_188 = (void *)((long)local_188 - lVar25);
          local_198 = (void *)((long)local_198 - lVar25);
          local_1c8 = (void *)((long)local_1c8 - lVar25);
          uVar5 = (int)(float)local_f8 + 1;
        }
        pvVar21 = (void *)((long)local_a8 + 1);
      }
    }
    else if (iVar8 == 2) {
      pvVar24 = (void *)0x0;
      if ((int)uVar1 < 1) {
        pvVar19 = pvVar24;
      }
      if ((int)_h < 1) {
        _h = 0;
      }
      if ((int)uVar5 < 1) {
        pvVar6 = pvVar24;
      }
      pvVar7 = (void *)(CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) *
                        local_148.cstep + (long)local_148.data);
      for (; pvVar24 != pvVar6; pvVar24 = (void *)((long)pvVar24 + 1)) {
        m.w = pMVar2->w;
        m.h = pMVar2->h;
        m.elemsize = pMVar2->elemsize;
        m.data = (void *)(pMVar2->cstep * (long)pvVar24 * m.elemsize + (long)pMVar2->data);
        m.c = pMVar2->d;
        m.elempack = pMVar2->elempack;
        m.allocator = pMVar2->allocator;
        m.refcount = (int *)0x0;
        m.d = 1;
        m.dims = pMVar2->dims + -1;
        m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
        if (pMVar2->dims == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        local_2d8 = (void *)(this_00->cstep * (long)pvVar24 * this_00->elemsize +
                            (long)this_00->data);
        pvVar17 = pvVar21;
        local_2a8 = pvVar7;
        for (uVar5 = 0; uVar5 != _h; uVar5 = uVar5 + 1) {
          iVar8 = this->padding_mode;
          iVar15 = this->align_corner;
          lVar27 = 0;
          for (lVar25 = 0; local_2f0 = (int)pvVar19, local_2f0 != (int)lVar25; lVar25 = lVar25 + 1)
          {
            fVar30 = *(float *)((long)local_2a8 + lVar25 * 4);
            fVar29 = compute_coord(*(float *)((long)pvVar17 + lVar25 * 4),uVar4,iVar8,iVar15);
            fVar30 = compute_coord(fVar30,w,iVar8,iVar15);
            fVar29 = floorf(fVar29 + 0.5);
            fVar30 = floorf(fVar30 + 0.5);
            fVar30 = get_value_bounded(&m,(int)fVar29,(int)fVar30);
            *(float *)((long)local_2d8 + lVar25 * 4) = fVar30;
            lVar27 = lVar27 + -4;
          }
          local_2a8 = (void *)((long)local_2a8 - lVar27);
          pvVar17 = (void *)((long)pvVar17 - lVar27);
          local_2d8 = (void *)((long)local_2d8 - lVar27);
        }
      }
    }
    else if (iVar8 == 3) {
      pvVar21 = (void *)0x0;
      if ((int)uVar1 < 1) {
        pvVar19 = pvVar21;
      }
      if ((int)_h < 1) {
        _h = 0;
      }
      if ((int)uVar5 < 1) {
        pvVar6 = pvVar21;
      }
      local_68 = local_148.data;
      local_70 = (void *)(CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) *
                          local_148.cstep + (long)local_148.data);
      while (pvVar21 != pvVar6) {
        m.w = pMVar2->w;
        m.h = pMVar2->h;
        m.elemsize = pMVar2->elemsize;
        m.data = (void *)(pMVar2->cstep * (long)pvVar21 * m.elemsize + (long)pMVar2->data);
        m.c = pMVar2->d;
        m.elempack = pMVar2->elempack;
        m.allocator = pMVar2->allocator;
        m.refcount = (int *)0x0;
        m.d = 1;
        m.dims = pMVar2->dims + -1;
        m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
        if (pMVar2->dims == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        local_150 = (void *)(this_00->cstep * (long)pvVar21 * this_00->elemsize +
                            (long)this_00->data);
        local_158 = local_70;
        local_160 = local_68;
        uVar4 = 0;
        local_60 = pvVar21;
        while (uVar4 != _h) {
          local_cc = this->padding_mode;
          iVar8 = this->align_corner;
          lVar25 = 0;
          local_d0 = uVar4;
          for (lVar27 = 0; local_2f0 = (int)pvVar19, local_2f0 != (int)lVar27; lVar27 = lVar27 + 1)
          {
            fVar30 = *(float *)((long)local_160 + lVar27 * 4);
            fVar29 = *(float *)((long)local_158 + lVar27 * 4);
            fVar31 = floorf(fVar30);
            x_00 = (int)fVar31;
            fVar32 = floorf(fVar29);
            iVar14 = local_cc;
            iVar13 = (int)fVar32;
            x = x_00 + -1;
            iVar15 = iVar13 + -1;
            x_01 = x_00 + 1;
            local_98 = (float)(iVar13 + 1);
            iVar9 = x_00 + 2;
            iVar23 = iVar13 + 2;
            fVar33 = get_value_bounded(&m,x,iVar15,local_cc,iVar8);
            fVar34 = get_value_bounded(&m,x_00,iVar15,iVar14,iVar8);
            fVar35 = get_value_bounded(&m,x_01,iVar15,iVar14,iVar8);
            fVar36 = get_value_bounded(&m,iVar9,iVar15,iVar14,iVar8);
            fVar37 = get_value_bounded(&m,x,iVar13,iVar14,iVar8);
            local_a8 = (void *)CONCAT44(extraout_XMM0_Db,fVar37);
            fVar37 = get_value_bounded(&m,x_00,iVar13,iVar14,iVar8);
            local_f8 = (void *)CONCAT44(extraout_XMM0_Db_00,fVar37);
            local_e8 = get_value_bounded(&m,x_01,iVar13,iVar14,iVar8);
            fVar38 = get_value_bounded(&m,iVar9,iVar13,iVar14,iVar8);
            fVar37 = local_98;
            fVar39 = get_value_bounded(&m,x,(int)local_98,iVar14,iVar8);
            local_b8 = (void *)CONCAT44(extraout_XMM0_Db_01,fVar39);
            local_88 = get_value_bounded(&m,x_00,(int)fVar37,iVar14,iVar8);
            fVar39 = get_value_bounded(&m,x_01,(int)fVar37,iVar14,iVar8);
            local_98 = get_value_bounded(&m,iVar9,(int)fVar37,iVar14,iVar8);
            fVar37 = get_value_bounded(&m,x,iVar23,iVar14,iVar8);
            local_c8 = (void *)CONCAT44(extraout_XMM0_Db_02,fVar37);
            fVar37 = get_value_bounded(&m,x_00,iVar23,iVar14,iVar8);
            fVar40 = get_value_bounded(&m,x_01,iVar23,iVar14,iVar8);
            fVar41 = get_value_bounded(&m,iVar9,iVar23,iVar14,iVar8);
            interpolate_cubic(fVar30 - (float)(int)fVar31,x_coeffs);
            interpolate_cubic(fVar29 - (float)(int)fVar32,y_coeffs);
            fVar30 = (float)x_coeffs._0_8_;
            fVar29 = SUB84(x_coeffs._0_8_,4);
            *(float *)((long)local_150 + lVar27 * 4) =
                 (fVar41 * x_coeffs[3] + fVar40 * x_coeffs[2] +
                 fVar37 * fVar29 + (float)local_c8 * fVar30) * y_coeffs[3] +
                 (fVar38 * x_coeffs[3] + local_e8 * x_coeffs[2] +
                 (float)local_f8 * fVar29 + (float)local_a8 * fVar30) * y_coeffs[1] +
                 (local_98 * x_coeffs[3] + fVar39 * x_coeffs[2] +
                 (float)local_b8 * fVar30 + local_88 * fVar29) * y_coeffs[2] +
                 (fVar36 * x_coeffs[3] + fVar35 * x_coeffs[2] + fVar33 * fVar30 + fVar34 * fVar29) *
                 y_coeffs[0];
            lVar25 = lVar25 + -4;
          }
          local_158 = (void *)((long)local_158 - lVar25);
          local_160 = (void *)((long)local_160 - lVar25);
          local_150 = (void *)((long)local_150 - lVar25);
          uVar4 = local_d0 + 1;
        }
        pvVar21 = (void *)((long)local_60 + 1);
      }
    }
    piVar3 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
    if (piVar3 == (int *)0x0) {
      return 0;
    }
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 != 0) {
      return 0;
    }
    if (local_148.allocator != (Allocator *)0x0) {
      (*(local_148.allocator)->_vptr_Allocator[3])();
      return 0;
    }
    free(local_148.data);
    return 0;
  }
  uVar1 = pMVar2->d;
  bVar28 = this->permute_fusion == 0;
  fVar30 = (float)(&pMVar2[1].w)[bVar28];
  fVar29 = (float)(&pMVar2[1].h)[bVar28];
  fVar37 = (float)(&pMVar2[1].d)[bVar28];
  Mat::create(this_00,(int)fVar30,(int)fVar29,(int)fVar37,uVar5,_elemsize,opt->blob_allocator);
  local_148.cstep = 0;
  local_148.data = (void *)0x0;
  local_148.refcount._0_4_ = 0;
  local_148.refcount._4_4_ = 0;
  local_148.elemsize._0_4_ = 0;
  local_148.elemsize._4_4_ = 0;
  local_148.elempack = 0;
  local_148.allocator = (Allocator *)0x0;
  local_148.dims = 0;
  local_148.w = 0;
  local_148.h = 0;
  local_148.d = 0;
  local_148.c = 0;
  Mat::create(&local_148,(int)fVar30,(int)fVar29,(int)fVar37,pMVar2[1].c,_elemsize,
              opt->workspace_allocator);
  iVar15 = -100;
  local_28c = -100;
  iVar8 = iVar15;
  if (((this_00->data == (void *)0x0) || ((long)this_00->c * this_00->cstep == 0)) ||
     ((local_2a8 = local_148.data, iVar8 = local_28c, local_148.data == (void *)0x0 ||
      ((long)local_148.c * local_148.cstep == 0)))) {
LAB_0051e85c:
    local_28c = iVar8;
    bVar28 = false;
  }
  else {
    if (this->permute_fusion == 0) {
      lVar25 = local_148.cstep * CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
      local_288 = (void *)((long)local_148.data + lVar25);
      local_1f8 = (void *)((long)local_148.data + lVar25 * 2);
      uVar11 = 0;
      fVar31 = 0.0;
      if (0 < (int)fVar30) {
        fVar31 = fVar30;
      }
      fVar32 = 0.0;
      if (0 < (int)fVar29) {
        fVar32 = fVar29;
      }
      uVar10 = 0;
      uVar12 = uVar10;
      if (0 < (int)fVar37) {
        uVar10 = (ulong)(uint)fVar37;
        uVar12 = uVar10;
      }
      for (; uVar11 != uVar12; uVar11 = uVar11 + 1) {
        pfVar20 = (float *)(pMVar2[1].cstep * uVar11 * pMVar2[1].elemsize + (long)pMVar2[1].data);
        for (fVar33 = 0.0; fVar33 != fVar32; fVar33 = (float)((int)fVar33 + 1)) {
          iVar8 = this->padding_mode;
          iVar23 = this->align_corner;
          lVar25 = 0;
          for (lVar27 = 0; fVar31 != (float)lVar27; lVar27 = lVar27 + 1) {
            fVar34 = pfVar20[1];
            fVar35 = pfVar20[2];
            fVar36 = grid_sample_unormalize((ncnn *)(ulong)uVar4,iVar23,*pfVar20,(int)uVar10);
            fVar36 = compute_coord(fVar36,uVar4,iVar8,iVar23);
            fVar34 = grid_sample_unormalize((ncnn *)(ulong)w,iVar23,fVar34,align_corner_03);
            fVar34 = compute_coord(fVar34,w,iVar8,iVar23);
            fVar35 = grid_sample_unormalize((ncnn *)(ulong)uVar1,iVar23,fVar35,align_corner_04);
            fVar35 = compute_coord(fVar35,uVar1,iVar8,iVar23);
            *(float *)((long)local_2a8 + lVar27 * 4) = fVar36;
            *(float *)((long)local_288 + lVar27 * 4) = fVar34;
            *(float *)((long)local_1f8 + lVar27 * 4) = fVar35;
            pfVar20 = pfVar20 + 3;
            lVar25 = lVar25 + -4;
            uVar10 = extraout_RDX_02;
          }
          local_2a8 = (void *)((long)local_2a8 - lVar25);
          local_288 = (void *)((long)local_288 - lVar25);
          local_1f8 = (void *)((long)local_1f8 - lVar25);
        }
      }
    }
    else {
      lVar27 = pMVar2[1].elemsize * pMVar2[1].cstep;
      local_288 = pMVar2[1].data;
      local_1f8 = (void *)((long)local_288 + lVar27);
      lVar25 = local_148.cstep * CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize);
      local_1d8 = (void *)((long)local_288 + lVar27 * 2);
      local_1c8 = (void *)((long)local_148.data + lVar25);
      pvVar19 = (void *)((long)local_148.data + lVar25 * 2);
      iVar8 = 0;
      local_e8 = 0.0;
      if (0 < (int)fVar30) {
        local_e8 = fVar30;
      }
      fVar31 = 0.0;
      if (0 < (int)fVar29) {
        fVar31 = fVar29;
      }
      uVar11 = 0;
      if (0 < (int)fVar37) {
        uVar11 = (ulong)(uint)fVar37;
      }
      local_f8 = (void *)CONCAT44(local_f8._4_4_,(int)uVar11);
      for (; (float)iVar8 != (float)local_f8; iVar8 = iVar8 + 1) {
        for (fVar32 = 0.0; fVar32 != fVar31; fVar32 = (float)((int)fVar32 + 1)) {
          iVar23 = this->padding_mode;
          iVar14 = this->align_corner;
          lVar25 = 0;
          fVar33 = local_e8;
          while (bVar28 = fVar33 != 0.0, fVar33 = (float)((int)fVar33 - 1), bVar28) {
            fVar34 = *(float *)((long)local_1f8 + lVar25);
            fVar35 = *(float *)((long)local_1d8 + lVar25);
            fVar36 = grid_sample_unormalize
                               ((ncnn *)(ulong)uVar4,iVar14,*(float *)((long)local_288 + lVar25),
                                (int)uVar11);
            fVar36 = compute_coord(fVar36,uVar4,iVar23,iVar14);
            fVar34 = grid_sample_unormalize((ncnn *)(ulong)w,iVar14,fVar34,align_corner_00);
            fVar34 = compute_coord(fVar34,w,iVar23,iVar14);
            fVar35 = grid_sample_unormalize((ncnn *)(ulong)uVar1,iVar14,fVar35,align_corner_01);
            fVar35 = compute_coord(fVar35,uVar1,iVar23,iVar14);
            *(float *)((long)local_2a8 + lVar25) = fVar36;
            *(float *)((long)local_1c8 + lVar25) = fVar34;
            *(float *)((long)pvVar19 + lVar25) = fVar35;
            lVar25 = lVar25 + 4;
            uVar11 = extraout_RDX_00;
          }
          local_288 = (void *)((long)local_288 + lVar25);
          local_1f8 = (void *)((long)local_1f8 + lVar25);
          local_1d8 = (void *)((long)local_1d8 + lVar25);
          local_2a8 = (void *)((long)local_2a8 + lVar25);
          local_1c8 = (void *)((long)local_1c8 + lVar25);
          pvVar19 = (void *)((long)pvVar19 + lVar25);
        }
      }
    }
    pvVar19 = local_148.data;
    iVar8 = this->sample_type;
    local_28c = iVar15;
    if (iVar8 == 1) {
      pvVar21 = (void *)(ulong)(uint)fVar30;
      if ((int)fVar30 < 1) {
        pvVar21 = (void *)0x0;
      }
      if ((int)fVar29 < 1) {
        fVar29 = 0.0;
      }
      if ((int)fVar37 < 1) {
        fVar37 = 0.0;
      }
      local_c8 = (void *)0x0;
      if ((int)uVar5 < 1) {
        pvVar6 = (void *)0x0;
      }
      lVar25 = CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) * local_148.cstep;
      pvVar24 = (void *)((long)local_148.data + lVar25);
      pvVar7 = (void *)((long)local_148.data + lVar25 * 2);
      for (; local_c8 != pvVar6; local_c8 = (void *)((long)local_c8 + 1)) {
        m.w = pMVar2->w;
        m.h = pMVar2->h;
        m.elemsize = pMVar2->elemsize;
        m.data = (void *)(pMVar2->cstep * (long)local_c8 * m.elemsize + (long)pMVar2->data);
        m.c = pMVar2->d;
        m.elempack = pMVar2->elempack;
        m.allocator = pMVar2->allocator;
        m.refcount = (int *)0x0;
        m.d = 1;
        m.dims = pMVar2->dims + -1;
        m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
        if (pMVar2->dims == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        local_f8 = (void *)(this_00->cstep * (long)local_c8 * this_00->elemsize +
                           (long)this_00->data);
        local_a8 = pvVar19;
        fVar30 = 0.0;
        local_1e0 = pvVar24;
        local_b8 = pvVar7;
        while (fVar30 != fVar37) {
          fVar31 = 0.0;
          local_88 = fVar30;
          while (fVar31 != fVar29) {
            lVar25 = 0;
            local_98 = fVar31;
            for (lVar27 = 0; local_2f0 = (int)pvVar21, local_2f0 != (int)lVar27; lVar27 = lVar27 + 1
                ) {
              fVar30 = *(float *)((long)local_a8 + lVar27 * 4);
              fVar31 = *(float *)((long)local_1e0 + lVar27 * 4);
              fVar32 = *(float *)((long)local_b8 + lVar27 * 4);
              fVar33 = floorf(fVar30);
              iVar13 = (int)fVar33;
              fVar34 = floorf(fVar31);
              iVar9 = (int)fVar34;
              fVar35 = floorf(fVar32);
              iVar14 = (int)fVar35;
              iVar8 = iVar13 + 1;
              iVar15 = iVar9 + 1;
              iVar23 = iVar14 + 1;
              fVar36 = get_value_bounded(&m,iVar13,iVar9,iVar14);
              fVar38 = get_value_bounded(&m,iVar8,iVar9,iVar14);
              fVar39 = get_value_bounded(&m,iVar13,iVar15,iVar14);
              fVar40 = get_value_bounded(&m,iVar8,iVar15,iVar14);
              fVar41 = get_value_bounded(&m,iVar13,iVar9,iVar23);
              fVar42 = get_value_bounded(&m,iVar8,iVar9,iVar23);
              local_e8 = get_value_bounded(&m,iVar13,iVar15,iVar23);
              fVar43 = get_value_bounded(&m,iVar8,iVar15,iVar23);
              fVar30 = fVar30 - (float)(int)fVar33;
              fVar31 = fVar31 - (float)(int)fVar34;
              fVar33 = 1.0 - fVar30;
              fVar34 = fVar31 * (fVar40 * fVar30 + fVar39 * fVar33) +
                       (1.0 - fVar31) * (fVar36 * fVar33 + fVar38 * fVar30);
              *(float *)((long)local_f8 + lVar27 * 4) =
                   (((1.0 - fVar31) * (fVar41 * fVar33 + fVar42 * fVar30) - fVar34) +
                   fVar31 * (fVar43 * fVar30 + local_e8 * fVar33)) * (fVar32 - (float)(int)fVar35) +
                   fVar34;
              lVar25 = lVar25 + -4;
            }
            local_f8 = (void *)((long)local_f8 - lVar25);
            local_a8 = (void *)((long)local_a8 - lVar25);
            local_1e0 = (void *)((long)local_1e0 - lVar25);
            local_b8 = (void *)((long)local_b8 - lVar25);
            fVar31 = (float)((int)local_98 + 1);
          }
          fVar30 = (float)((int)local_88 + 1);
        }
      }
    }
    else {
      if (iVar8 != 2) {
        bVar28 = true;
        if (iVar8 != 3) goto LAB_0051e85e;
        fwrite("unsupported bicubic when dims == 4",0x22,1,_stderr);
        fputc(10,_stderr);
        local_28c = -1;
        iVar8 = local_28c;
        goto LAB_0051e85c;
      }
      pvVar24 = (void *)0x0;
      pvVar21 = (void *)(ulong)(uint)fVar30;
      if ((int)fVar30 < 1) {
        pvVar21 = pvVar24;
      }
      if ((int)fVar29 < 1) {
        fVar29 = 0.0;
      }
      if ((int)fVar37 < 1) {
        fVar37 = 0.0;
      }
      if ((int)uVar5 < 1) {
        pvVar6 = pvVar24;
      }
      lVar25 = CONCAT44(local_148.elemsize._4_4_,(undefined4)local_148.elemsize) * local_148.cstep;
      pvVar7 = (void *)((long)local_148.data + lVar25);
      pvVar17 = (void *)((long)local_148.data + lVar25 * 2);
      for (; pvVar24 != pvVar6; pvVar24 = (void *)((long)pvVar24 + 1)) {
        m.w = pMVar2->w;
        m.h = pMVar2->h;
        m.elemsize = pMVar2->elemsize;
        m.data = (void *)(pMVar2->cstep * (long)pvVar24 * m.elemsize + (long)pMVar2->data);
        m.c = pMVar2->d;
        m.elempack = pMVar2->elempack;
        m.allocator = pMVar2->allocator;
        m.refcount = (int *)0x0;
        m.d = 1;
        m.dims = pMVar2->dims + -1;
        m.cstep = (m.elemsize * (long)m.h * (long)m.w + 0xf & 0xfffffffffffffff0) / m.elemsize;
        if (pMVar2->dims == 4) {
          m.cstep = (long)m.h * (long)m.w;
        }
        local_208 = (void *)(this_00->cstep * (long)pvVar24 * this_00->elemsize +
                            (long)this_00->data);
        local_278 = pvVar19;
        pvVar16 = pvVar17;
        pvVar22 = pvVar7;
        for (fVar30 = 0.0; fVar30 != fVar37; fVar30 = (float)((int)fVar30 + 1)) {
          for (fVar31 = 0.0; fVar31 != fVar29; fVar31 = (float)((int)fVar31 + 1)) {
            lVar27 = 0;
            lVar25 = 0;
            while( true ) {
              local_2f0 = (int)pvVar21;
              if (local_2f0 == (int)lVar27) break;
              fVar32 = floorf(*(float *)((long)local_278 + lVar27 * 4) + 0.5);
              fVar33 = floorf(*(float *)((long)pvVar22 + lVar27 * 4) + 0.5);
              fVar34 = floorf(*(float *)((long)pvVar16 + lVar27 * 4) + 0.5);
              fVar32 = get_value_bounded(&m,(int)fVar32,(int)fVar33,(int)fVar34);
              *(float *)((long)local_208 + lVar27 * 4) = fVar32;
              lVar25 = lVar25 + -4;
              lVar27 = lVar27 + 1;
            }
            local_208 = (void *)((long)local_208 - lVar25);
            local_278 = (void *)((long)local_278 - lVar25);
            pvVar22 = (void *)((long)pvVar22 - lVar25);
            pvVar16 = (void *)((long)pvVar16 - lVar25);
          }
        }
      }
    }
    bVar28 = true;
  }
LAB_0051e85e:
  piVar3 = (int *)CONCAT44(local_148.refcount._4_4_,local_148.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_148.allocator == (Allocator *)0x0) {
        free(local_148.data);
      }
      else {
        (*(local_148.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (bVar28) {
    return 0;
  }
  return local_28c;
}

Assistant:

int GridSample::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    const Mat& grid = bottom_blobs[1];
    Mat& top_blob = top_blobs[0];

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;
    int channels = bottom_blob.c;
    int dims = bottom_blob.dims;
    size_t elemsize = bottom_blob.elemsize;

    if (dims == 3)
    {
        int outw = permute_fusion == 0 ? grid.h : grid.w;
        int outh = permute_fusion == 0 ? grid.c : grid.h;

        top_blob.create(outw, outh, channels, elemsize, opt.blob_allocator);

        Mat offset_blob;
        offset_blob.create(outw, outh, grid.c, elemsize, opt.workspace_allocator);

        if (top_blob.empty() || offset_blob.empty())
            return -100;

        //pre-calculate all interpolation offsets for each x y, unpack grid on-the-fly
        if (permute_fusion == 0)
        {
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);

            for (int y = 0; y < outh; y++)
            {
                const float* gridptr = grid.channel(y);
                for (int x = 0; x < outw; x++)
                {
                    float sample_x = gridptr[0];
                    float sample_y = gridptr[1];

                    sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                    sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                    *offsetptr_x = sample_x;
                    *offsetptr_y = sample_y;

                    gridptr += 2;
                    offsetptr_x++;
                    offsetptr_y++;
                }
            }
        }
        else
        {
            const float* gridptr_x = grid.channel(0);
            const float* gridptr_y = grid.channel(1);
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);

            for (int y = 0; y < outh; y++)
            {
                for (int x = 0; x < outw; x++)
                {
                    float sample_x = *gridptr_x;
                    float sample_y = *gridptr_y;

                    sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                    sample_y = grid_sample_unormalize(h, sample_y, align_corner);

                    *offsetptr_x = sample_x;
                    *offsetptr_y = sample_y;

                    gridptr_x++;
                    gridptr_y++;
                    offsetptr_x++;
                    offsetptr_y++;
                }
            }
        }

        if (sample_type == Interpolation_BILINEAR) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);

                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *offsetptr_x;
                        float sample_y = *offsetptr_y;

                        // bilinear interpolate
                        float v;
                        {
                            sample_x = compute_coord(sample_x, w, padding_mode, align_corner);
                            sample_y = compute_coord(sample_y, h, padding_mode, align_corner);
                            int x0 = floor(sample_x);
                            int y0 = floor(sample_y);
                            int x1 = x0 + 1;
                            int y1 = y0 + 1;

                            float v00 = get_value_bounded(image, x0, y0);
                            float v01 = get_value_bounded(image, x1, y0);
                            float v10 = get_value_bounded(image, x0, y1);
                            float v11 = get_value_bounded(image, x1, y1);

                            float alpha = sample_x - x0;
                            float beta = sample_y - y0;

                            float v0 = v00 * (1 - alpha) + v01 * alpha;
                            float v1 = v10 * (1 - alpha) + v11 * alpha;

                            v = v0 * (1 - beta) + v1 * beta;
                        }

                        outptr[0] = v;
                        outptr += 1;

                        offsetptr_x++;
                        offsetptr_y++;
                    }
                }
            }
        }
        else if (sample_type == Interpolation_NEAREST) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);

                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *offsetptr_x;
                        float sample_y = *offsetptr_y;
                        sample_x = compute_coord(sample_x, w, padding_mode, align_corner);
                        sample_y = compute_coord(sample_y, h, padding_mode, align_corner);

                        int x0 = static_cast<int>(floor(sample_x + 0.5f));
                        int y0 = static_cast<int>(floor(sample_y + 0.5f));

                        float v = get_value_bounded(image, x0, y0);

                        outptr[0] = v;
                        outptr += 1;

                        offsetptr_x++;
                        offsetptr_y++;
                    }
                }
            }
        }
        else if (sample_type == Interpolation_BICUBIC) // bicubic
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);

                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *offsetptr_x;
                        float sample_y = *offsetptr_y;

                        // bicubic interpolate
                        float v;
                        {
                            int x1 = (int)floorf(sample_x);
                            int y1 = (int)floorf(sample_y);
                            int x0 = x1 - 1;
                            int y0 = y1 - 1;
                            int x2 = x1 + 1;
                            int y2 = y1 + 1;
                            int x3 = x1 + 2;
                            int y3 = y1 + 2;

                            float v00 = get_value_bounded(image, x0, y0, padding_mode, align_corner);
                            float v01 = get_value_bounded(image, x1, y0, padding_mode, align_corner);
                            float v02 = get_value_bounded(image, x2, y0, padding_mode, align_corner);
                            float v03 = get_value_bounded(image, x3, y0, padding_mode, align_corner);
                            float v10 = get_value_bounded(image, x0, y1, padding_mode, align_corner);
                            float v11 = get_value_bounded(image, x1, y1, padding_mode, align_corner);
                            float v12 = get_value_bounded(image, x2, y1, padding_mode, align_corner);
                            float v13 = get_value_bounded(image, x3, y1, padding_mode, align_corner);
                            float v20 = get_value_bounded(image, x0, y2, padding_mode, align_corner);
                            float v21 = get_value_bounded(image, x1, y2, padding_mode, align_corner);
                            float v22 = get_value_bounded(image, x2, y2, padding_mode, align_corner);
                            float v23 = get_value_bounded(image, x3, y2, padding_mode, align_corner);
                            float v30 = get_value_bounded(image, x0, y3, padding_mode, align_corner);
                            float v31 = get_value_bounded(image, x1, y3, padding_mode, align_corner);
                            float v32 = get_value_bounded(image, x2, y3, padding_mode, align_corner);
                            float v33 = get_value_bounded(image, x3, y3, padding_mode, align_corner);

                            float x_coeffs[4];
                            float y_coeffs[4];
                            interpolate_cubic(sample_x - x1, x_coeffs);
                            interpolate_cubic(sample_y - y1, y_coeffs);

                            float v0 = v00 * x_coeffs[0] + v01 * x_coeffs[1] + v02 * x_coeffs[2] + v03 * x_coeffs[3];
                            float v1 = v10 * x_coeffs[0] + v11 * x_coeffs[1] + v12 * x_coeffs[2] + v13 * x_coeffs[3];
                            float v2 = v20 * x_coeffs[0] + v21 * x_coeffs[1] + v22 * x_coeffs[2] + v23 * x_coeffs[3];
                            float v3 = v30 * x_coeffs[0] + v31 * x_coeffs[1] + v32 * x_coeffs[2] + v33 * x_coeffs[3];

                            v = v0 * y_coeffs[0] + v1 * y_coeffs[1] + v2 * y_coeffs[2] + v3 * y_coeffs[3];
                        }

                        outptr[0] = v;
                        outptr += 1;

                        offsetptr_x++;
                        offsetptr_y++;
                    }
                }
            }
        }
    }

    if (dims == 4)
    {
        int outw = permute_fusion == 0 ? grid.h : grid.w;
        int outh = permute_fusion == 0 ? grid.d : grid.h;
        int outd = permute_fusion == 0 ? grid.c : grid.d;

        top_blob.create(outw, outh, outd, channels, elemsize, opt.blob_allocator);

        Mat offset_blob;
        offset_blob.create(outw, outh, outd, grid.c, elemsize, opt.workspace_allocator);

        if (top_blob.empty() || offset_blob.empty())
            return -100;

        //pre-calculate all interpolation offsets for each x y, unpack grid on-the-fly
        if (permute_fusion == 0)
        {
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);
            float* offsetptr_z = offset_blob.channel(2);

            for (int z = 0; z < outd; z++)
            {
                const float* gridptr = grid.channel(z);
                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = gridptr[0];
                        float sample_y = gridptr[1];
                        float sample_z = gridptr[2];

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_x = compute_coord(sample_x, w, padding_mode, align_corner);

                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                        sample_y = compute_coord(sample_y, h, padding_mode, align_corner);

                        sample_z = grid_sample_unormalize(d, sample_z, align_corner);
                        sample_z = compute_coord(sample_z, d, padding_mode, align_corner);

                        *offsetptr_x = sample_x;
                        *offsetptr_y = sample_y;
                        *offsetptr_z = sample_z;

                        gridptr += 3;
                        offsetptr_x++;
                        offsetptr_y++;
                        offsetptr_z++;
                    }
                }
            }
        }
        else
        {
            const float* gridptr_x = grid.channel(0);
            const float* gridptr_y = grid.channel(1);
            const float* gridptr_z = grid.channel(2);
            float* offsetptr_x = offset_blob.channel(0);
            float* offsetptr_y = offset_blob.channel(1);
            float* offsetptr_z = offset_blob.channel(2);

            for (int z = 0; z < outd; z++)
            {
                for (int y = 0; y < outh; y++)
                {
                    for (int x = 0; x < outw; x++)
                    {
                        float sample_x = *gridptr_x;
                        float sample_y = *gridptr_y;
                        float sample_z = *gridptr_z;

                        sample_x = grid_sample_unormalize(w, sample_x, align_corner);
                        sample_x = compute_coord(sample_x, w, padding_mode, align_corner);

                        sample_y = grid_sample_unormalize(h, sample_y, align_corner);
                        sample_y = compute_coord(sample_y, h, padding_mode, align_corner);

                        sample_z = grid_sample_unormalize(d, sample_z, align_corner);
                        sample_z = compute_coord(sample_z, d, padding_mode, align_corner);

                        *offsetptr_x = sample_x;
                        *offsetptr_y = sample_y;
                        *offsetptr_z = sample_z;

                        gridptr_x++;
                        gridptr_y++;
                        gridptr_z++;
                        offsetptr_x++;
                        offsetptr_y++;
                        offsetptr_z++;
                    }
                }
            }
        }

        if (sample_type == Interpolation_BILINEAR) // bilinear
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);
                const float* offsetptr_z = offset_blob.channel(2);

                for (int z = 0; z < outd; z++)
                {
                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = *offsetptr_x;
                            float sample_y = *offsetptr_y;
                            float sample_z = *offsetptr_z;

                            // bilinear interpolate
                            float v;
                            {
                                int x0 = (int)floor(sample_x);
                                int y0 = (int)floor(sample_y);
                                int z0 = (int)floor(sample_z);
                                int x1 = x0 + 1;
                                int y1 = y0 + 1;
                                int z1 = z0 + 1;

                                float v000 = get_value_bounded(image, x0, y0, z0);
                                float v001 = get_value_bounded(image, x1, y0, z0);
                                float v010 = get_value_bounded(image, x0, y1, z0);
                                float v011 = get_value_bounded(image, x1, y1, z0);
                                float v100 = get_value_bounded(image, x0, y0, z1);
                                float v101 = get_value_bounded(image, x1, y0, z1);
                                float v110 = get_value_bounded(image, x0, y1, z1);
                                float v111 = get_value_bounded(image, x1, y1, z1);

                                float alpha = sample_x - x0;
                                float beta = sample_y - y0;
                                float gamma = sample_z - z0;

                                float v00 = v000 * (1 - alpha) + v001 * alpha;
                                float v01 = v010 * (1 - alpha) + v011 * alpha;
                                float v10 = v100 * (1 - alpha) + v101 * alpha;
                                float v11 = v110 * (1 - alpha) + v111 * alpha;

                                float v0 = v00 * (1 - beta) + v01 * beta;
                                float v1 = v10 * (1 - beta) + v11 * beta;

                                v = v0 * (1 - gamma) + v1 * gamma;
                            }

                            outptr[0] = v;
                            outptr += 1;

                            offsetptr_x++;
                            offsetptr_y++;
                            offsetptr_z++;
                        }
                    }
                }
            }
        }
        else if (sample_type == Interpolation_NEAREST) // nearest
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const Mat image = bottom_blob.channel(q);
                float* outptr = top_blob.channel(q);
                const float* offsetptr_x = offset_blob.channel(0);
                const float* offsetptr_y = offset_blob.channel(1);
                const float* offsetptr_z = offset_blob.channel(2);

                for (int z = 0; z < outd; z++)
                {
                    for (int y = 0; y < outh; y++)
                    {
                        for (int x = 0; x < outw; x++)
                        {
                            float sample_x = *offsetptr_x;
                            float sample_y = *offsetptr_y;
                            float sample_z = *offsetptr_z;

                            int x0 = static_cast<int>(floor(sample_x + 0.5f));
                            int y0 = static_cast<int>(floor(sample_y + 0.5f));
                            int z0 = static_cast<int>(floor(sample_z + 0.5f));

                            float v = get_value_bounded(image, x0, y0, z0);

                            outptr[0] = v;
                            outptr += 1;

                            offsetptr_x++;
                            offsetptr_y++;
                            offsetptr_z++;
                        }
                    }
                }
            }
        }
        else if (sample_type == 3)
        {
            NCNN_LOGE("unsupported bicubic when dims == 4");
            return -1;
        }
    }

    return 0;
}